

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardOptions.hpp
# Opt level: O2

void __thiscall
Configurable::QuickloadOption<MSX::Machine::Options>::declare_quickload_option
          (QuickloadOption<MSX::Machine::Options> *this)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"quickload",&local_31);
  Reflection::StructImpl<MSX::Machine::Options>::declare<bool>
            ((StructImpl<MSX::Machine::Options> *)(this + -0xc),&this->quickload,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void declare_quickload_option() {
			static_cast<Owner *>(this)->declare(&quickload, "quickload");
		}